

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

uint64_t __thiscall pstore::file::file_handle::size(file_handle *this)

{
  int iVar1;
  int *piVar2;
  undefined1 local_c8 [44];
  int err;
  stat buf;
  file_handle *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)this;
  ensure_open(this);
  memset(local_c8 + 0x28,0,0x90);
  iVar1 = fstat(this->file_,(stat *)(local_c8 + 0x28));
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_c8._36_4_ = iVar1;
    path_abi_cxx11_((file_handle *)local_c8);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"fstat failed",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  }
  if (-1 < (long)buf.st_rdev) {
    return buf.st_rdev;
  }
  assert_failed("buf.st_size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x150);
}

Assistant:

std::uint64_t file_handle::size () {
            this->ensure_open ();
            struct stat buf {};
            if (::fstat (file_, &buf) == -1) {
                int const err = errno;
                raise_file_error (err, "fstat failed", this->path ());
            }

            static_assert (std::numeric_limits<std::uint64_t>::max () >=
                               unsigned_cast (std::numeric_limits<decltype (buf.st_size)>::max ()),
                           "stat.st_size is too large for uint64_t");
            PSTORE_ASSERT (buf.st_size >= 0);
            return static_cast<std::uint64_t> (buf.st_size);
        }